

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QFileDialogPrivate::HistoryItem>::
emplace<QFileDialogPrivate::HistoryItem>
          (QGenericArrayOps<QFileDialogPrivate::HistoryItem> *this,qsizetype i,HistoryItem *args)

{
  qsizetype *pqVar1;
  HistoryItem **ppHVar2;
  Data *pDVar3;
  HistoryItem *pHVar4;
  QArrayData *pQVar5;
  qsizetype qVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  Data *pDVar9;
  QPersistentModelIndex *pQVar10;
  qsizetype qVar11;
  QTypedArrayData<char16_t> *__old_val;
  longlong __old_val_1;
  long in_FS_OFFSET;
  bool bVar12;
  Inserter local_b8;
  HistoryItem local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_004f3c29:
    pQVar5 = &((args->path).d.d)->super_QArrayData;
    (args->path).d.d = (Data *)0x0;
    local_68.path.d.ptr = (args->path).d.ptr;
    (args->path).d.ptr = (char16_t *)0x0;
    qVar6 = (args->path).d.size;
    (args->path).d.size = 0;
    local_68.selection.d.d = (args->selection).d.d;
    local_68.selection.d.ptr = (args->selection).d.ptr;
    (args->selection).d.d = (Data *)0x0;
    (args->selection).d.ptr = (QPersistentModelIndex *)0x0;
    local_68.selection.d.size = (args->selection).d.size;
    (args->selection).d.size = 0;
    bVar12 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size != 0;
    local_68.path.d.d = (Data *)pQVar5;
    local_68.path.d.size = qVar6;
    QArrayDataPointer<QFileDialogPrivate::HistoryItem>::detachAndGrow
              (&this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>,
               (uint)(i == 0 && bVar12),1,(HistoryItem **)0x0,
               (QArrayDataPointer<QFileDialogPrivate::HistoryItem> *)0x0);
    qVar11 = local_68.selection.d.size;
    pQVar10 = local_68.selection.d.ptr;
    pDVar9 = local_68.selection.d.d;
    pcVar8 = local_68.path.d.ptr;
    if (i == 0 && bVar12) {
      pHVar4 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).ptr;
      local_68.path.d.d = (Data *)0x0;
      pHVar4[-1].path.d.d = (Data *)pQVar5;
      local_68.path.d.ptr = (char16_t *)0x0;
      pHVar4[-1].path.d.ptr = pcVar8;
      local_68.path.d.size = 0;
      pHVar4[-1].path.d.size = qVar6;
      local_68.selection.d.d = (Data *)0x0;
      pHVar4[-1].selection.d.d = pDVar9;
      local_68.selection.d.ptr = (QPersistentModelIndex *)0x0;
      pHVar4[-1].selection.d.ptr = pQVar10;
      local_68.selection.d.size = 0;
      pHVar4[-1].selection.d.size = qVar11;
      (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).ptr = pHVar4 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      local_b8.sourceCopyConstruct = 0;
      local_b8.nSource = 0;
      local_b8.move = 0;
      local_b8.sourceCopyAssign = 0;
      local_b8.end = (HistoryItem *)0x0;
      local_b8.last = (HistoryItem *)0x0;
      local_b8.where = (HistoryItem *)0x0;
      local_b8.begin = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).ptr;
      local_b8.size = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size;
      local_b8.data = &this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>;
      Inserter::insertOne(&local_b8,i,&local_68);
      (local_b8.data)->ptr = local_b8.begin;
      (local_b8.data)->size = local_b8.size;
    }
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_68.selection.d);
    if (&(local_68.path.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_68.path.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    if (((this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size == i) &&
       (pHVar4 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pHVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
       -0x5555555555555555)) {
      pDVar7 = (args->path).d.d;
      (args->path).d.d = (Data *)0x0;
      pHVar4[i].path.d.d = pDVar7;
      pcVar8 = (args->path).d.ptr;
      (args->path).d.ptr = (char16_t *)0x0;
      pHVar4[i].path.d.ptr = pcVar8;
      qVar6 = (args->path).d.size;
      (args->path).d.size = 0;
      pHVar4[i].path.d.size = qVar6;
      pDVar9 = (args->selection).d.d;
      (args->selection).d.d = (Data *)0x0;
      pHVar4[i].selection.d.d = pDVar9;
      pQVar10 = (args->selection).d.ptr;
      (args->selection).d.ptr = (QPersistentModelIndex *)0x0;
      pHVar4[i].selection.d.ptr = pQVar10;
      qVar6 = (args->selection).d.size;
      (args->selection).d.size = 0;
      pHVar4[i].selection.d.size = qVar6;
    }
    else {
      if ((i != 0) ||
         (pHVar4 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).ptr,
         (HistoryItem *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pHVar4)) goto LAB_004f3c29;
      pDVar7 = (args->path).d.d;
      (args->path).d.d = (Data *)0x0;
      pHVar4[-1].path.d.d = pDVar7;
      pcVar8 = (args->path).d.ptr;
      (args->path).d.ptr = (char16_t *)0x0;
      pHVar4[-1].path.d.ptr = pcVar8;
      qVar6 = (args->path).d.size;
      (args->path).d.size = 0;
      pHVar4[-1].path.d.size = qVar6;
      pDVar9 = (args->selection).d.d;
      (args->selection).d.d = (Data *)0x0;
      pHVar4[-1].selection.d.d = pDVar9;
      pQVar10 = (args->selection).d.ptr;
      (args->selection).d.ptr = (QPersistentModelIndex *)0x0;
      pHVar4[-1].selection.d.ptr = pQVar10;
      qVar6 = (args->selection).d.size;
      (args->selection).d.size = 0;
      pHVar4[-1].selection.d.size = qVar6;
      ppHVar2 = &(this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).ptr;
      *ppHVar2 = *ppHVar2 + -1;
    }
    pqVar1 = &(this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }